

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool __thiscall crnd::crn_unpacker::decode_alpha_selectors_etcs(crn_unpacker *this)

{
  byte *pbVar1;
  crn_header *pcVar2;
  unsigned_short *puVar3;
  uint uVar4;
  byte bVar5;
  sbyte sVar6;
  ushort uVar7;
  uint32 uVar8;
  uint uVar9;
  uint8 *puVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint i;
  int iVar15;
  uint8 s_linear [8];
  static_huffman_data_model dm;
  
  pcVar2 = this->m_pHeader;
  uVar11 = (uint)(pcVar2->m_alpha_selectors).m_size.m_buf[2] |
           (uint)(pcVar2->m_alpha_selectors).m_size.m_buf[1] << 8 |
           (uint)(pcVar2->m_alpha_selectors).m_size.m_buf[0] << 0x10;
  if (uVar11 != 0) {
    puVar10 = this->m_pData +
              ((ulong)(pcVar2->m_alpha_selectors).m_ofs.m_buf[2] |
              (ulong)((uint)(pcVar2->m_alpha_selectors).m_ofs.m_buf[0] << 0x10 |
                     (uint)(pcVar2->m_alpha_selectors).m_ofs.m_buf[1] << 8));
    (this->m_codec).m_pDecode_buf = puVar10;
    (this->m_codec).m_pDecode_buf_next = puVar10;
    (this->m_codec).m_decode_buf_size = uVar11;
    (this->m_codec).m_pDecode_buf_end = puVar10 + uVar11;
    (this->m_codec).m_bit_buf = 0;
    (this->m_codec).m_bit_count = 0;
  }
  dm.m_total_syms = 0;
  dm.m_code_sizes.m_p = (uchar *)0x0;
  dm.m_code_sizes.m_size = 0;
  dm.m_code_sizes.m_capacity = 0;
  dm.m_code_sizes.m_alloc_failed = false;
  dm.m_pDecode_tables = (decoder_tables *)0x0;
  symbol_codec::decode_receive_static_data_model(&this->m_codec,&dm);
  uVar7 = *(ushort *)(this->m_pHeader->m_alpha_selectors).m_num.m_buf;
  uVar7 = uVar7 << 8 | uVar7 >> 8;
  vector<unsigned_short>::resize(&this->m_alpha_selectors,(uint)uVar7 + (uint)uVar7 * 2);
  s_linear[0] = '\0';
  s_linear[1] = '\0';
  s_linear[2] = '\0';
  s_linear[3] = '\0';
  s_linear[4] = '\0';
  s_linear[5] = '\0';
  s_linear[6] = '\0';
  s_linear[7] = '\0';
  puVar3 = (this->m_alpha_selectors).m_p;
  for (uVar11 = 0; uVar11 < (this->m_alpha_selectors).m_size * 2; uVar11 = uVar11 + 6) {
    iVar15 = 3;
    uVar13 = 0;
    for (uVar14 = 0; uVar14 != 0x10; uVar14 = uVar14 + 1) {
      if ((uVar14 & 1) == 0) {
        uVar8 = symbol_codec::decode(&this->m_codec,&dm);
        bVar5 = (byte)uVar8 ^ s_linear[uVar14 >> 1];
        s_linear[uVar14 >> 1] = bVar5;
        uVar13 = (ulong)bVar5;
      }
      else {
        uVar13 = uVar13 >> 3;
      }
      uVar9 = (uVar14 & 3) * 9 + iVar15 + (uVar14 >> 2) * -9;
      uVar12 = (uint)uVar13 & 7;
      uVar4 = 3 - uVar12;
      if (3 < uVar12) {
        uVar4 = uVar12;
      }
      uVar12 = uVar9 & 7;
      sVar6 = (sbyte)uVar12;
      uVar9 = (uVar9 >> 3 & 0x1f) + uVar11;
      pbVar1 = (byte *)((long)puVar3 + (ulong)uVar9);
      *pbVar1 = *pbVar1 | (byte)(uVar4 << (8U - sVar6 & 0x1f));
      if (uVar12 < 3) {
        pbVar1 = (byte *)((long)puVar3 + (ulong)(uVar9 - 1));
        *pbVar1 = *pbVar1 | (byte)(uVar4 >> sVar6);
      }
      iVar15 = iVar15 + 3;
    }
  }
  static_huffman_data_model::~static_huffman_data_model(&dm);
  return true;
}

Assistant:

bool decode_alpha_selectors_etcs()
        {
            m_codec.start_decoding(m_pData + m_pHeader->m_alpha_selectors.m_ofs, m_pHeader->m_alpha_selectors.m_size);
            static_huffman_data_model dm;
            m_codec.decode_receive_static_data_model(dm);
            m_alpha_selectors.resize(m_pHeader->m_alpha_selectors.m_num * 3);
            uint8 s_linear[8] = {};
            uint8* data = (uint8*)m_alpha_selectors.begin();
            for (uint i = 0; i < (m_alpha_selectors.size() << 1); i += 6)
            {
                for (uint s_group = 0, p = 0; p < 16; p++)
                {
                    s_group = p & 1 ? s_group >> 3 : s_linear[p >> 1] ^= m_codec.decode(dm);
                    uint8 s = s_group & 7;
                    if (s <= 3)
                        s = 3 - s;
                    uint8 d = 3 * (p + 1) + 9 * ((p & 3) - (p >> 2));
                    uint8 byte_offset = d >> 3;
                    uint8 bit_offset = d & 7;
                    data[i + byte_offset] |= s << (8 - bit_offset);
                    if (bit_offset < 3)
                        data[i + byte_offset - 1] |= s >> bit_offset;
                }
            }
            m_codec.stop_decoding();
            return true;
        }